

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

z_uLong z_deflateBound(z_streamp strm,z_uLong sourceLen)

{
  internal_state *piVar1;
  z_uLong zVar2;
  
  if ((((strm != (z_streamp)0x0) && (piVar1 = strm->state, piVar1 != (internal_state *)0x0)) &&
      (piVar1->w_bits == 0xf)) && (piVar1->hash_bits == 0xf)) {
    zVar2 = z_compressBound(sourceLen);
    return zVar2;
  }
  return (sourceLen + 7 >> 3) + sourceLen + (sourceLen + 0x3f >> 6) + 0xb;
}

Assistant:

uLong ZEXPORT deflateBound(strm, sourceLen)
    z_streamp strm;
    uLong sourceLen;
{
    deflate_state *s;
    uLong destLen;

    /* conservative upper bound */
    destLen = sourceLen +
              ((sourceLen + 7) >> 3) + ((sourceLen + 63) >> 6) + 11;

    /* if can't get parameters, return conservative bound */
    if (strm == Z_NULL || strm->state == Z_NULL)
        return destLen;

    /* if not default parameters, return conservative bound */
    s = strm->state;
    if (s->w_bits != 15 || s->hash_bits != 8 + 7)
        return destLen;

    /* default settings: return tight bound for that case */
    return compressBound(sourceLen);
}